

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O2

void set_icon(GLFWwindow *window,int icon_color)

{
  uchar (*pauVar1) [4];
  long lVar2;
  uchar auVar3 [4];
  long lVar4;
  GLFWimage img;
  uchar pixels [1024];
  
  img.width = 0x10;
  img.height = 0x10;
  img.pixels = pixels;
  pauVar1 = (uchar (*) [4])img.pixels;
  for (lVar2 = 0; lVar2 < 0x10; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 < 0x10; lVar4 = lVar4 + 1) {
      auVar3[0] = '\0';
      auVar3[1] = '\0';
      auVar3[2] = '\0';
      auVar3[3] = '\0';
      if (logo[lVar2][lVar4] == '0') {
        auVar3 = icon_colors[(uint)icon_color];
      }
      *pauVar1 = auVar3;
      pauVar1 = pauVar1 + 1;
    }
  }
  glfwSetWindowIcon(window,1,&img);
  return;
}

Assistant:

static void set_icon(GLFWwindow* window, int icon_color)
{
    int x, y;
    unsigned char pixels[16 * 16 * 4];
    unsigned char* target = pixels;
    GLFWimage img = { 16, 16, pixels };

    for (y = 0;  y < img.width;  y++)
    {
        for (x = 0;  x < img.height;  x++)
        {
            if (logo[y][x] == '0')
                memcpy(target, icon_colors[icon_color], 4);
            else
                memset(target, 0, 4);

            target += 4;
        }
    }

    glfwSetWindowIcon(window, 1, &img);
}